

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

char * CaptureHashCount(char *szDataPtr,char *szDataEnd,size_t *PtrHashCount)

{
  bool local_41;
  long local_40;
  size_t HashCount;
  BYTE HashValue [16];
  size_t *PtrHashCount_local;
  char *szDataEnd_local;
  char *szDataPtr_local;
  
  local_40 = 0;
  HashValue._8_8_ = PtrHashCount;
  szDataEnd_local = szDataPtr;
  while( true ) {
    if (szDataEnd <= szDataEnd_local) {
      *(long *)HashValue._8_8_ = local_40;
      return szDataEnd_local;
    }
    szDataEnd_local = CaptureSingleHash(szDataEnd_local,szDataEnd,(LPBYTE)&HashCount,0x10);
    if (szDataEnd_local == (char *)0x0) break;
    while( true ) {
      local_41 = false;
      if (szDataEnd_local < szDataEnd) {
        local_41 = IsWhiteSpace(szDataEnd_local);
      }
      if (local_41 == false) break;
      szDataEnd_local = szDataEnd_local + 1;
    }
    local_40 = local_40 + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char * CaptureHashCount(const char * szDataPtr, const char * szDataEnd, size_t * PtrHashCount)
{
    BYTE HashValue[MD5_HASH_SIZE];
    size_t HashCount = 0;

    // Capculate the hash count
    while (szDataPtr < szDataEnd)
    {
        // Check one hash
        szDataPtr = CaptureSingleHash(szDataPtr, szDataEnd, HashValue, MD5_HASH_SIZE);
        if (szDataPtr == NULL)
            return NULL;

        // Skip all whitespaces
        while (szDataPtr < szDataEnd && IsWhiteSpace(szDataPtr))
            szDataPtr++;

        HashCount++;
    }

    // Give results
    PtrHashCount[0] = HashCount;
    return szDataPtr;
}